

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * closeDirPath(string *__return_storage_ptr__,string *src,char delimiter)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  if (delimiter == ' ') {
    getDirSeparator();
  }
  sVar1 = src->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (src->_M_dataplus)._M_p;
    pcVar3 = pcVar2;
  }
  else {
    pcVar3 = (src->_M_dataplus)._M_p;
    pcVar2 = pcVar3 + sVar1;
    if ((pcVar3[sVar1 - 1] != '\\') && (pcVar3[sVar1 - 1] != '/')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string closeDirPath(const string& src, char delimiter)
{
    if (delimiter == ' ')
        delimiter = getDirSeparator();
    if (src.length() == 0)
        return src;
    if (src[src.length() - 1] == '/' || src[src.length() - 1] == '\\')
        return src;
    return src + delimiter;
}